

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ValidateEnum(Parser *this,EnumDescriptorProto *proto)

{
  _Base_ptr p_Var1;
  char cVar2;
  Rep *pRVar3;
  char *pcVar4;
  ErrorCollector *pEVar5;
  Parser *pPVar6;
  int iVar7;
  Type *from;
  LogMessage *pLVar8;
  Type *pTVar9;
  long *plVar10;
  long lVar11;
  _Base_ptr p_Var12;
  _Base_ptr *pp_Var13;
  size_type *psVar14;
  byte bVar15;
  bool bVar16;
  int iVar17;
  undefined8 *puVar18;
  undefined1 *puVar19;
  long lVar20;
  _Base_ptr p_Var21;
  void **ppvVar22;
  void **ppvVar23;
  bool bVar24;
  string error_1;
  set<int,_std::less<int>,_std::allocator<int>_> used_values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  Parser *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [12];
  uint uStack_f4;
  _Base_ptr local_f0;
  _Base_ptr p_Stack_e8;
  _Base_ptr local_e0;
  Rep *local_d8;
  ArenaStringPtr local_d0;
  LogMessage local_a0;
  LogMessage local_68;
  
  puVar19 = (undefined1 *)proto->options_;
  if ((EnumOptions *)puVar19 == (EnumOptions *)0x0) {
    puVar19 = _EnumOptions_default_instance_;
  }
  iVar17 = 0;
  local_128 = this;
  if ((((EnumOptions *)puVar19)->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ < 1
     ) {
    bVar24 = true;
    bVar16 = false;
  }
  else {
    bVar15 = 0;
    bVar16 = false;
    do {
      from = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                       (&(((EnumOptions *)puVar19)->uninterpreted_option_).
                         super_RepeatedPtrFieldBase,iVar17);
      UninterpretedOption::UninterpretedOption((UninterpretedOption *)local_100,from);
      bVar24 = false;
      if ((int)local_e0 < 2) {
        if ((int)local_e0 < 1) {
          internal::LogMessage::LogMessage
                    (&local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar8 = internal::LogMessage::operator<<
                             (&local_a0,"CHECK failed: (index) < (current_size_): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
          internal::LogMessage::~LogMessage(&local_a0);
        }
        bVar24 = false;
        if (*(char *)((long)local_d8->elements[0] + 0x20) == '\0') {
          if ((int)local_e0 < 1) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                       ,0x358);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_68,"CHECK failed: (index) < (current_size_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar8);
            internal::LogMessage::~LogMessage(&local_68);
          }
          iVar7 = std::__cxx11::string::compare
                            ((char *)(*(ulong *)((long)local_d8->elements[0] + 0x18) &
                                     0xfffffffffffffffe));
          if (iVar7 == 0) {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((ulong)local_d0.tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            if (iVar7 == 0) {
              bVar16 = true;
            }
            bVar15 = 1;
            bVar24 = true;
          }
        }
      }
      UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_100);
      if (bVar24) break;
      puVar19 = (undefined1 *)proto->options_;
      if ((EnumOptions *)puVar19 == (EnumOptions *)0x0) {
        puVar19 = _EnumOptions_default_instance_;
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < (((EnumOptions *)puVar19)->uninterpreted_option_).super_RepeatedPtrFieldBase.
                      current_size_);
    bVar24 = (bool)(bVar15 ^ 1 | bVar16);
  }
  if (bVar24) {
    p_Var1 = (_Base_ptr)(local_100 + 8);
    stack0xffffffffffffff08 = (ulong)uStack_f4 << 0x20;
    iVar17 = 0;
    local_f0 = (_Base_ptr)0x0;
    local_d8 = (Rep *)0x0;
    p_Stack_e8 = p_Var1;
    local_e0 = p_Var1;
    if ((proto->value_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      bVar24 = false;
    }
    else {
      do {
        pTVar9 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                           (&(proto->value_).super_RepeatedPtrFieldBase,iVar17);
        iVar7 = pTVar9->number_;
        p_Var12 = p_Var1;
        for (p_Var21 = local_f0; p_Var21 != (_Base_ptr)0x0;
            p_Var21 = (&p_Var21->_M_left)[(int)p_Var21[1]._M_color < iVar7]) {
          if (iVar7 <= (int)p_Var21[1]._M_color) {
            p_Var12 = p_Var21;
          }
        }
        p_Var21 = p_Var1;
        if ((p_Var12 != p_Var1) && (p_Var21 = p_Var12, iVar7 < (int)p_Var12[1]._M_color)) {
          p_Var21 = p_Var1;
        }
        bVar24 = true;
        if (p_Var21 != p_Var1) break;
        local_148._M_dataplus._M_p._0_4_ = iVar7;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_100,(int *)&local_148);
        iVar17 = iVar17 + 1;
        bVar24 = false;
      } while (iVar17 < (proto->value_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (bVar16) {
      bVar16 = true;
      if (!bVar24) {
        std::operator+(&local_120,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_120);
        pPVar6 = local_128;
        psVar14 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_148.field_2._M_allocated_capacity = *psVar14;
          local_148.field_2._8_8_ = plVar10[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar14;
          local_148._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_148._M_string_length = plVar10[1];
        *plVar10 = (long)psVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        pEVar5 = pPVar6->error_collector_;
        if (pEVar5 != (ErrorCollector *)0x0) {
          (*pEVar5->_vptr_ErrorCollector[2])
                    (pEVar5,(ulong)(uint)(pPVar6->input_->current_).line,
                     (ulong)(uint)(pPVar6->input_->current_).column,&local_148);
        }
        pPVar6->had_errors_ = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        bVar16 = false;
      }
    }
    else {
      pRVar3 = (proto->value_).super_RepeatedPtrFieldBase.rep_;
      ppvVar22 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar22 = (void **)0x0;
      }
      lVar11 = (long)(proto->value_).super_RepeatedPtrFieldBase.current_size_;
      bVar16 = true;
      if (lVar11 != 0) {
        ppvVar23 = ppvVar22 + lVar11;
        do {
          puVar18 = (undefined8 *)(*(ulong *)((long)*ppvVar22 + 0x18) & 0xfffffffffffffffe);
          lVar11 = puVar18[1];
          bVar24 = lVar11 == 0;
          if (!bVar24) {
            pcVar4 = (char *)*puVar18;
            cVar2 = *pcVar4;
            if ((((byte)(cVar2 - 0x30U) < 10) || (cVar2 == '_')) || ((byte)(cVar2 + 0xbfU) < 0x1a))
            {
              lVar20 = 1;
              do {
                bVar24 = lVar11 == lVar20;
                if (bVar24) break;
                cVar2 = pcVar4[lVar20];
                lVar20 = lVar20 + 1;
              } while ((((byte)(cVar2 - 0x30U) < 10) || (cVar2 == '_')) ||
                      ((byte)(cVar2 + 0xbfU) < 0x1a));
            }
          }
          if (!bVar24) {
            std::operator+(&local_120,"Enum constant should be in UPPER_CASE. Found: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(ulong *)((long)*ppvVar22 + 0x18) & 0xfffffffffffffffe));
            puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
            psVar14 = puVar18 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_148.field_2._M_allocated_capacity = *psVar14;
              local_148.field_2._8_8_ = puVar18[3];
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar14;
              local_148._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_148._M_string_length = puVar18[1];
            *puVar18 = psVar14;
            puVar18[1] = 0;
            *(undefined1 *)(puVar18 + 2) = 0;
            pEVar5 = local_128->error_collector_;
            if (pEVar5 != (ErrorCollector *)0x0) {
              (*pEVar5->_vptr_ErrorCollector[3])
                        (pEVar5,(ulong)(uint)(local_128->input_->current_).line,
                         (ulong)(uint)(local_128->input_->current_).column,&local_148);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
          }
          ppvVar22 = ppvVar22 + 1;
        } while (ppvVar22 != ppvVar23);
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_100);
  }
  else {
    std::operator+(&local_148,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
    pPVar6 = local_128;
    pp_Var13 = (_Base_ptr *)(plVar10 + 2);
    if ((_Base_ptr *)*plVar10 == pp_Var13) {
      local_f0 = *pp_Var13;
      p_Stack_e8 = (_Base_ptr)plVar10[3];
      local_100._0_8_ = &local_f0;
    }
    else {
      local_f0 = *pp_Var13;
      local_100._0_8_ = (_Base_ptr *)*plVar10;
    }
    unique0x00012000 = plVar10[1];
    *plVar10 = (long)pp_Var13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    pEVar5 = pPVar6->error_collector_;
    if (pEVar5 != (ErrorCollector *)0x0) {
      (*pEVar5->_vptr_ErrorCollector[2])
                (pEVar5,(ulong)(uint)(pPVar6->input_->current_).line,
                 (ulong)(uint)(pPVar6->input_->current_).column,local_100);
    }
    pPVar6->had_errors_ = true;
    if ((_Base_ptr *)local_100._0_8_ != &local_f0) {
      operator_delete((void *)local_100._0_8_);
    }
    bVar16 = false;
  }
  return bVar16;
}

Assistant:

bool Parser::ValidateEnum(const EnumDescriptorProto* proto) {
  bool has_allow_alias = false;
  bool allow_alias = false;

  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption option = proto->options().uninterpreted_option(i);
    if (option.name_size() > 1) {
      continue;
    }
    if (!option.name(0).is_extension() &&
        option.name(0).name_part() == "allow_alias") {
      has_allow_alias = true;
      if (option.identifier_value() == "true") {
        allow_alias = true;
      }
      break;
    }
  }

  if (has_allow_alias && !allow_alias) {
    std::string error =
        "\"" + proto->name() +
        "\" declares 'option allow_alias = false;' which has no effect. "
        "Please remove the declaration.";
    // This needlessly clutters declarations with nops.
    AddError(error);
    return false;
  }

  std::set<int> used_values;
  bool has_duplicates = false;
  for (int i = 0; i < proto->value_size(); ++i) {
    const EnumValueDescriptorProto& enum_value = proto->value(i);
    if (used_values.find(enum_value.number()) != used_values.end()) {
      has_duplicates = true;
      break;
    } else {
      used_values.insert(enum_value.number());
    }
  }
  if (allow_alias && !has_duplicates) {
    std::string error =
        "\"" + proto->name() +
        "\" declares support for enum aliases but no enum values share field "
        "numbers. Please remove the unnecessary 'option allow_alias = true;' "
        "declaration.";
    // Generate an error if an enum declares support for duplicate enum values
    // and does not use it protect future authors.
    AddError(error);
    return false;
  }

  // Enforce that enum constants must be UPPER_CASE except in case of
  // enum_alias.
  if (!allow_alias) {
    for (const auto& enum_value : proto->value()) {
      if (!IsUpperUnderscore(enum_value.name())) {
        AddWarning(
            "Enum constant should be in UPPER_CASE. Found: " +
            enum_value.name() +
            ". See https://developers.google.com/protocol-buffers/docs/style");
      }
    }
  }

  return true;
}